

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomNormalDynamicLayerParams::SharedCtor
          (RandomNormalDynamicLayerParams *this)

{
  this->seed_ = 0;
  this->mean_ = 0.0;
  this->stddev_ = 0.0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void RandomNormalDynamicLayerParams::SharedCtor() {
  ::memset(&seed_, 0, reinterpret_cast<char*>(&stddev_) -
    reinterpret_cast<char*>(&seed_) + sizeof(stddev_));
  _cached_size_ = 0;
}